

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O0

Vec_Wrd_t * Lms_GiaDelays(Gia_Man_t *p)

{
  int iVar1;
  Vec_Wrd_t *p_00;
  word D2;
  Vec_Wrd_t *p_01;
  word wVar2;
  bool bVar3;
  int local_2c;
  Gia_Obj_t *pGStack_28;
  int i;
  Gia_Obj_t *pObj;
  Vec_Wrd_t *vResult;
  Vec_Wrd_t *vDelays;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManObjNum(p);
  p_00 = Vec_WrdAlloc(iVar1);
  Vec_WrdPush(p_00,0);
  local_2c = 1;
  while( true ) {
    bVar3 = false;
    if (local_2c < p->nObjs) {
      pGStack_28 = Gia_ManObj(p,local_2c);
      bVar3 = pGStack_28 != (Gia_Obj_t *)0x0;
    }
    if (!bVar3) break;
    iVar1 = Gia_ObjIsAnd(pGStack_28);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsCo(pGStack_28);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjIsCi(pGStack_28);
        if (iVar1 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRec3.c"
                        ,0xae,"Vec_Wrd_t *Lms_GiaDelays(Gia_Man_t *)");
        }
        iVar1 = Gia_ObjCioId(pGStack_28);
        wVar2 = Lms_DelayInit(iVar1);
        Vec_WrdPush(p_00,wVar2);
      }
      else {
        iVar1 = Gia_ObjFaninId0(pGStack_28,local_2c);
        wVar2 = Vec_WrdEntry(p_00,iVar1);
        iVar1 = Gia_ManCiNum(p);
        wVar2 = Lms_DelayDecrement(wVar2,iVar1);
        Vec_WrdPush(p_00,wVar2);
      }
    }
    else {
      iVar1 = Gia_ObjFaninId0(pGStack_28,local_2c);
      wVar2 = Vec_WrdEntry(p_00,iVar1);
      iVar1 = Gia_ObjFaninId1(pGStack_28,local_2c);
      D2 = Vec_WrdEntry(p_00,iVar1);
      iVar1 = Gia_ManCiNum(p);
      wVar2 = Lms_DelayMax(wVar2,D2,iVar1);
      Vec_WrdPush(p_00,wVar2);
    }
    local_2c = local_2c + 1;
  }
  iVar1 = Gia_ManCoNum(p);
  p_01 = Vec_WrdAlloc(iVar1);
  local_2c = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCos);
    bVar3 = false;
    if (local_2c < iVar1) {
      pGStack_28 = Gia_ManCo(p,local_2c);
      bVar3 = pGStack_28 != (Gia_Obj_t *)0x0;
    }
    if (!bVar3) break;
    iVar1 = Gia_ObjId(p,pGStack_28);
    wVar2 = Vec_WrdEntry(p_00,iVar1);
    Vec_WrdPush(p_01,wVar2);
    local_2c = local_2c + 1;
  }
  Vec_WrdFree(p_00);
  return p_01;
}

Assistant:

Vec_Wrd_t * Lms_GiaDelays( Gia_Man_t * p )
{
    Vec_Wrd_t * vDelays, * vResult;
    Gia_Obj_t * pObj;
    int i;
    // compute delay profiles of all objects
    vDelays = Vec_WrdAlloc( Gia_ManObjNum(p) );
    Vec_WrdPush( vDelays, 0 ); // const 0
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            Vec_WrdPush( vDelays, Lms_DelayMax( Vec_WrdEntry(vDelays, Gia_ObjFaninId0(pObj, i)), Vec_WrdEntry(vDelays, Gia_ObjFaninId1(pObj, i)), Gia_ManCiNum(p) ) );
        else if ( Gia_ObjIsCo(pObj) )
            Vec_WrdPush( vDelays, Lms_DelayDecrement( Vec_WrdEntry(vDelays, Gia_ObjFaninId0(pObj, i)), Gia_ManCiNum(p) ) );
        else if ( Gia_ObjIsCi(pObj) )
            Vec_WrdPush( vDelays, Lms_DelayInit( Gia_ObjCioId(pObj) ) );
        else assert( 0 );
    }
    // collect delay profiles of COs only
    vResult = Vec_WrdAlloc( Gia_ManCoNum(p) );
    Gia_ManForEachCo( p, pObj, i )
        Vec_WrdPush( vResult, Vec_WrdEntry(vDelays, Gia_ObjId(p, pObj)) );
    Vec_WrdFree( vDelays );
    return vResult;
}